

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O0

char * amqp_method_name(amqp_method_number_t methodNumber)

{
  amqp_method_number_t methodNumber_local;
  char *local_8;
  
  if (methodNumber == 0xa000a) {
    local_8 = "AMQP_CONNECTION_START_METHOD";
  }
  else if (methodNumber == 0xa000b) {
    local_8 = "AMQP_CONNECTION_START_OK_METHOD";
  }
  else if (methodNumber == 0xa0014) {
    local_8 = "AMQP_CONNECTION_SECURE_METHOD";
  }
  else if (methodNumber == 0xa0015) {
    local_8 = "AMQP_CONNECTION_SECURE_OK_METHOD";
  }
  else if (methodNumber == 0xa001e) {
    local_8 = "AMQP_CONNECTION_TUNE_METHOD";
  }
  else if (methodNumber == 0xa001f) {
    local_8 = "AMQP_CONNECTION_TUNE_OK_METHOD";
  }
  else if (methodNumber == 0xa0028) {
    local_8 = "AMQP_CONNECTION_OPEN_METHOD";
  }
  else if (methodNumber == 0xa0029) {
    local_8 = "AMQP_CONNECTION_OPEN_OK_METHOD";
  }
  else if (methodNumber == 0xa0032) {
    local_8 = "AMQP_CONNECTION_CLOSE_METHOD";
  }
  else if (methodNumber == 0xa0033) {
    local_8 = "AMQP_CONNECTION_CLOSE_OK_METHOD";
  }
  else if (methodNumber == 0xa003c) {
    local_8 = "AMQP_CONNECTION_BLOCKED_METHOD";
  }
  else if (methodNumber == 0xa003d) {
    local_8 = "AMQP_CONNECTION_UNBLOCKED_METHOD";
  }
  else if (methodNumber == 0xa0046) {
    local_8 = "AMQP_CONNECTION_UPDATE_SECRET_METHOD";
  }
  else if (methodNumber == 0xa0047) {
    local_8 = "AMQP_CONNECTION_UPDATE_SECRET_OK_METHOD";
  }
  else if (methodNumber == 0x14000a) {
    local_8 = "AMQP_CHANNEL_OPEN_METHOD";
  }
  else if (methodNumber == 0x14000b) {
    local_8 = "AMQP_CHANNEL_OPEN_OK_METHOD";
  }
  else if (methodNumber == 0x140014) {
    local_8 = "AMQP_CHANNEL_FLOW_METHOD";
  }
  else if (methodNumber == 0x140015) {
    local_8 = "AMQP_CHANNEL_FLOW_OK_METHOD";
  }
  else if (methodNumber == 0x140028) {
    local_8 = "AMQP_CHANNEL_CLOSE_METHOD";
  }
  else if (methodNumber == 0x140029) {
    local_8 = "AMQP_CHANNEL_CLOSE_OK_METHOD";
  }
  else if (methodNumber == 0x1e000a) {
    local_8 = "AMQP_ACCESS_REQUEST_METHOD";
  }
  else if (methodNumber == 0x1e000b) {
    local_8 = "AMQP_ACCESS_REQUEST_OK_METHOD";
  }
  else if (methodNumber == 0x28000a) {
    local_8 = "AMQP_EXCHANGE_DECLARE_METHOD";
  }
  else if (methodNumber == 0x28000b) {
    local_8 = "AMQP_EXCHANGE_DECLARE_OK_METHOD";
  }
  else if (methodNumber == 0x280014) {
    local_8 = "AMQP_EXCHANGE_DELETE_METHOD";
  }
  else if (methodNumber == 0x280015) {
    local_8 = "AMQP_EXCHANGE_DELETE_OK_METHOD";
  }
  else if (methodNumber == 0x28001e) {
    local_8 = "AMQP_EXCHANGE_BIND_METHOD";
  }
  else if (methodNumber == 0x28001f) {
    local_8 = "AMQP_EXCHANGE_BIND_OK_METHOD";
  }
  else if (methodNumber == 0x280028) {
    local_8 = "AMQP_EXCHANGE_UNBIND_METHOD";
  }
  else if (methodNumber == 0x280033) {
    local_8 = "AMQP_EXCHANGE_UNBIND_OK_METHOD";
  }
  else if (methodNumber == 0x32000a) {
    local_8 = "AMQP_QUEUE_DECLARE_METHOD";
  }
  else if (methodNumber == 0x32000b) {
    local_8 = "AMQP_QUEUE_DECLARE_OK_METHOD";
  }
  else if (methodNumber == 0x320014) {
    local_8 = "AMQP_QUEUE_BIND_METHOD";
  }
  else if (methodNumber == 0x320015) {
    local_8 = "AMQP_QUEUE_BIND_OK_METHOD";
  }
  else if (methodNumber == 0x32001e) {
    local_8 = "AMQP_QUEUE_PURGE_METHOD";
  }
  else if (methodNumber == 0x32001f) {
    local_8 = "AMQP_QUEUE_PURGE_OK_METHOD";
  }
  else if (methodNumber == 0x320028) {
    local_8 = "AMQP_QUEUE_DELETE_METHOD";
  }
  else if (methodNumber == 0x320029) {
    local_8 = "AMQP_QUEUE_DELETE_OK_METHOD";
  }
  else if (methodNumber == 0x320032) {
    local_8 = "AMQP_QUEUE_UNBIND_METHOD";
  }
  else if (methodNumber == 0x320033) {
    local_8 = "AMQP_QUEUE_UNBIND_OK_METHOD";
  }
  else if (methodNumber == 0x3c000a) {
    local_8 = "AMQP_BASIC_QOS_METHOD";
  }
  else if (methodNumber == 0x3c000b) {
    local_8 = "AMQP_BASIC_QOS_OK_METHOD";
  }
  else if (methodNumber == 0x3c0014) {
    local_8 = "AMQP_BASIC_CONSUME_METHOD";
  }
  else if (methodNumber == 0x3c0015) {
    local_8 = "AMQP_BASIC_CONSUME_OK_METHOD";
  }
  else if (methodNumber == 0x3c001e) {
    local_8 = "AMQP_BASIC_CANCEL_METHOD";
  }
  else if (methodNumber == 0x3c001f) {
    local_8 = "AMQP_BASIC_CANCEL_OK_METHOD";
  }
  else if (methodNumber == 0x3c0028) {
    local_8 = "AMQP_BASIC_PUBLISH_METHOD";
  }
  else if (methodNumber == 0x3c0032) {
    local_8 = "AMQP_BASIC_RETURN_METHOD";
  }
  else if (methodNumber == 0x3c003c) {
    local_8 = "AMQP_BASIC_DELIVER_METHOD";
  }
  else if (methodNumber == 0x3c0046) {
    local_8 = "AMQP_BASIC_GET_METHOD";
  }
  else if (methodNumber == 0x3c0047) {
    local_8 = "AMQP_BASIC_GET_OK_METHOD";
  }
  else if (methodNumber == 0x3c0048) {
    local_8 = "AMQP_BASIC_GET_EMPTY_METHOD";
  }
  else if (methodNumber == 0x3c0050) {
    local_8 = "AMQP_BASIC_ACK_METHOD";
  }
  else if (methodNumber == 0x3c005a) {
    local_8 = "AMQP_BASIC_REJECT_METHOD";
  }
  else if (methodNumber == 0x3c0064) {
    local_8 = "AMQP_BASIC_RECOVER_ASYNC_METHOD";
  }
  else if (methodNumber == 0x3c006e) {
    local_8 = "AMQP_BASIC_RECOVER_METHOD";
  }
  else if (methodNumber == 0x3c006f) {
    local_8 = "AMQP_BASIC_RECOVER_OK_METHOD";
  }
  else if (methodNumber == 0x3c0078) {
    local_8 = "AMQP_BASIC_NACK_METHOD";
  }
  else if (methodNumber == 0x55000a) {
    local_8 = "AMQP_CONFIRM_SELECT_METHOD";
  }
  else if (methodNumber == 0x55000b) {
    local_8 = "AMQP_CONFIRM_SELECT_OK_METHOD";
  }
  else if (methodNumber == 0x5a000a) {
    local_8 = "AMQP_TX_SELECT_METHOD";
  }
  else if (methodNumber == 0x5a000b) {
    local_8 = "AMQP_TX_SELECT_OK_METHOD";
  }
  else if (methodNumber == 0x5a0014) {
    local_8 = "AMQP_TX_COMMIT_METHOD";
  }
  else if (methodNumber == 0x5a0015) {
    local_8 = "AMQP_TX_COMMIT_OK_METHOD";
  }
  else if (methodNumber == 0x5a001e) {
    local_8 = "AMQP_TX_ROLLBACK_METHOD";
  }
  else if (methodNumber == 0x5a001f) {
    local_8 = "AMQP_TX_ROLLBACK_OK_METHOD";
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

char const *amqp_method_name(amqp_method_number_t methodNumber) {
  switch (methodNumber) {
    case AMQP_CONNECTION_START_METHOD:
      return "AMQP_CONNECTION_START_METHOD";
    case AMQP_CONNECTION_START_OK_METHOD:
      return "AMQP_CONNECTION_START_OK_METHOD";
    case AMQP_CONNECTION_SECURE_METHOD:
      return "AMQP_CONNECTION_SECURE_METHOD";
    case AMQP_CONNECTION_SECURE_OK_METHOD:
      return "AMQP_CONNECTION_SECURE_OK_METHOD";
    case AMQP_CONNECTION_TUNE_METHOD:
      return "AMQP_CONNECTION_TUNE_METHOD";
    case AMQP_CONNECTION_TUNE_OK_METHOD:
      return "AMQP_CONNECTION_TUNE_OK_METHOD";
    case AMQP_CONNECTION_OPEN_METHOD:
      return "AMQP_CONNECTION_OPEN_METHOD";
    case AMQP_CONNECTION_OPEN_OK_METHOD:
      return "AMQP_CONNECTION_OPEN_OK_METHOD";
    case AMQP_CONNECTION_CLOSE_METHOD:
      return "AMQP_CONNECTION_CLOSE_METHOD";
    case AMQP_CONNECTION_CLOSE_OK_METHOD:
      return "AMQP_CONNECTION_CLOSE_OK_METHOD";
    case AMQP_CONNECTION_BLOCKED_METHOD:
      return "AMQP_CONNECTION_BLOCKED_METHOD";
    case AMQP_CONNECTION_UNBLOCKED_METHOD:
      return "AMQP_CONNECTION_UNBLOCKED_METHOD";
    case AMQP_CONNECTION_UPDATE_SECRET_METHOD:
      return "AMQP_CONNECTION_UPDATE_SECRET_METHOD";
    case AMQP_CONNECTION_UPDATE_SECRET_OK_METHOD:
      return "AMQP_CONNECTION_UPDATE_SECRET_OK_METHOD";
    case AMQP_CHANNEL_OPEN_METHOD:
      return "AMQP_CHANNEL_OPEN_METHOD";
    case AMQP_CHANNEL_OPEN_OK_METHOD:
      return "AMQP_CHANNEL_OPEN_OK_METHOD";
    case AMQP_CHANNEL_FLOW_METHOD:
      return "AMQP_CHANNEL_FLOW_METHOD";
    case AMQP_CHANNEL_FLOW_OK_METHOD:
      return "AMQP_CHANNEL_FLOW_OK_METHOD";
    case AMQP_CHANNEL_CLOSE_METHOD:
      return "AMQP_CHANNEL_CLOSE_METHOD";
    case AMQP_CHANNEL_CLOSE_OK_METHOD:
      return "AMQP_CHANNEL_CLOSE_OK_METHOD";
    case AMQP_ACCESS_REQUEST_METHOD:
      return "AMQP_ACCESS_REQUEST_METHOD";
    case AMQP_ACCESS_REQUEST_OK_METHOD:
      return "AMQP_ACCESS_REQUEST_OK_METHOD";
    case AMQP_EXCHANGE_DECLARE_METHOD:
      return "AMQP_EXCHANGE_DECLARE_METHOD";
    case AMQP_EXCHANGE_DECLARE_OK_METHOD:
      return "AMQP_EXCHANGE_DECLARE_OK_METHOD";
    case AMQP_EXCHANGE_DELETE_METHOD:
      return "AMQP_EXCHANGE_DELETE_METHOD";
    case AMQP_EXCHANGE_DELETE_OK_METHOD:
      return "AMQP_EXCHANGE_DELETE_OK_METHOD";
    case AMQP_EXCHANGE_BIND_METHOD:
      return "AMQP_EXCHANGE_BIND_METHOD";
    case AMQP_EXCHANGE_BIND_OK_METHOD:
      return "AMQP_EXCHANGE_BIND_OK_METHOD";
    case AMQP_EXCHANGE_UNBIND_METHOD:
      return "AMQP_EXCHANGE_UNBIND_METHOD";
    case AMQP_EXCHANGE_UNBIND_OK_METHOD:
      return "AMQP_EXCHANGE_UNBIND_OK_METHOD";
    case AMQP_QUEUE_DECLARE_METHOD:
      return "AMQP_QUEUE_DECLARE_METHOD";
    case AMQP_QUEUE_DECLARE_OK_METHOD:
      return "AMQP_QUEUE_DECLARE_OK_METHOD";
    case AMQP_QUEUE_BIND_METHOD:
      return "AMQP_QUEUE_BIND_METHOD";
    case AMQP_QUEUE_BIND_OK_METHOD:
      return "AMQP_QUEUE_BIND_OK_METHOD";
    case AMQP_QUEUE_PURGE_METHOD:
      return "AMQP_QUEUE_PURGE_METHOD";
    case AMQP_QUEUE_PURGE_OK_METHOD:
      return "AMQP_QUEUE_PURGE_OK_METHOD";
    case AMQP_QUEUE_DELETE_METHOD:
      return "AMQP_QUEUE_DELETE_METHOD";
    case AMQP_QUEUE_DELETE_OK_METHOD:
      return "AMQP_QUEUE_DELETE_OK_METHOD";
    case AMQP_QUEUE_UNBIND_METHOD:
      return "AMQP_QUEUE_UNBIND_METHOD";
    case AMQP_QUEUE_UNBIND_OK_METHOD:
      return "AMQP_QUEUE_UNBIND_OK_METHOD";
    case AMQP_BASIC_QOS_METHOD:
      return "AMQP_BASIC_QOS_METHOD";
    case AMQP_BASIC_QOS_OK_METHOD:
      return "AMQP_BASIC_QOS_OK_METHOD";
    case AMQP_BASIC_CONSUME_METHOD:
      return "AMQP_BASIC_CONSUME_METHOD";
    case AMQP_BASIC_CONSUME_OK_METHOD:
      return "AMQP_BASIC_CONSUME_OK_METHOD";
    case AMQP_BASIC_CANCEL_METHOD:
      return "AMQP_BASIC_CANCEL_METHOD";
    case AMQP_BASIC_CANCEL_OK_METHOD:
      return "AMQP_BASIC_CANCEL_OK_METHOD";
    case AMQP_BASIC_PUBLISH_METHOD:
      return "AMQP_BASIC_PUBLISH_METHOD";
    case AMQP_BASIC_RETURN_METHOD:
      return "AMQP_BASIC_RETURN_METHOD";
    case AMQP_BASIC_DELIVER_METHOD:
      return "AMQP_BASIC_DELIVER_METHOD";
    case AMQP_BASIC_GET_METHOD:
      return "AMQP_BASIC_GET_METHOD";
    case AMQP_BASIC_GET_OK_METHOD:
      return "AMQP_BASIC_GET_OK_METHOD";
    case AMQP_BASIC_GET_EMPTY_METHOD:
      return "AMQP_BASIC_GET_EMPTY_METHOD";
    case AMQP_BASIC_ACK_METHOD:
      return "AMQP_BASIC_ACK_METHOD";
    case AMQP_BASIC_REJECT_METHOD:
      return "AMQP_BASIC_REJECT_METHOD";
    case AMQP_BASIC_RECOVER_ASYNC_METHOD:
      return "AMQP_BASIC_RECOVER_ASYNC_METHOD";
    case AMQP_BASIC_RECOVER_METHOD:
      return "AMQP_BASIC_RECOVER_METHOD";
    case AMQP_BASIC_RECOVER_OK_METHOD:
      return "AMQP_BASIC_RECOVER_OK_METHOD";
    case AMQP_BASIC_NACK_METHOD:
      return "AMQP_BASIC_NACK_METHOD";
    case AMQP_TX_SELECT_METHOD:
      return "AMQP_TX_SELECT_METHOD";
    case AMQP_TX_SELECT_OK_METHOD:
      return "AMQP_TX_SELECT_OK_METHOD";
    case AMQP_TX_COMMIT_METHOD:
      return "AMQP_TX_COMMIT_METHOD";
    case AMQP_TX_COMMIT_OK_METHOD:
      return "AMQP_TX_COMMIT_OK_METHOD";
    case AMQP_TX_ROLLBACK_METHOD:
      return "AMQP_TX_ROLLBACK_METHOD";
    case AMQP_TX_ROLLBACK_OK_METHOD:
      return "AMQP_TX_ROLLBACK_OK_METHOD";
    case AMQP_CONFIRM_SELECT_METHOD:
      return "AMQP_CONFIRM_SELECT_METHOD";
    case AMQP_CONFIRM_SELECT_OK_METHOD:
      return "AMQP_CONFIRM_SELECT_OK_METHOD";
    default:
      return NULL;
  }
}